

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void applyNumericAffinity(Mem *pRec,int bTryForInt)

{
  u8 enc;
  undefined2 uVar1;
  undefined2 uVar2;
  char *z;
  ushort uVar3;
  int iVar4;
  int iVar5;
  i64 iValue;
  double rValue;
  MemValue local_38;
  MemValue local_30;
  
  z = pRec->z;
  iVar5 = pRec->n;
  enc = pRec->enc;
  iVar4 = sqlite3AtoF(z,&local_30.r,iVar5,enc);
  if (iVar4 != 0) {
    iVar5 = sqlite3Atoi64(z,&local_38.i,iVar5,enc);
    if (iVar5 == 0) {
      pRec->u = local_38;
      uVar2 = pRec->flags;
      uVar3 = uVar2 | 4;
    }
    else {
      pRec->u = local_30;
      uVar1 = pRec->flags;
      uVar3 = uVar1 | 8;
      pRec->flags = uVar3;
      if (bTryForInt != 0) {
        sqlite3VdbeIntegerAffinity(pRec);
        uVar3 = pRec->flags;
      }
    }
    pRec->flags = uVar3 & 0xfffd;
  }
  return;
}

Assistant:

static void applyNumericAffinity(Mem *pRec, int bTryForInt){
  double rValue;
  i64 iValue;
  u8 enc = pRec->enc;
  assert( (pRec->flags & (MEM_Str|MEM_Int|MEM_Real))==MEM_Str );
  if( sqlite3AtoF(pRec->z, &rValue, pRec->n, enc)==0 ) return;
  if( 0==sqlite3Atoi64(pRec->z, &iValue, pRec->n, enc) ){
    pRec->u.i = iValue;
    pRec->flags |= MEM_Int;
  }else{
    pRec->u.r = rValue;
    pRec->flags |= MEM_Real;
    if( bTryForInt ) sqlite3VdbeIntegerAffinity(pRec);
  }
  /* TEXT->NUMERIC is many->one.  Hence, it is important to invalidate the
  ** string representation after computing a numeric equivalent, because the
  ** string representation might not be the canonical representation for the
  ** numeric value.  Ticket [343634942dd54ab57b7024] 2018-01-31. */
  pRec->flags &= ~MEM_Str;
}